

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O1

void __thiscall PacketProcessor::restart(PacketProcessor *this,uint32_t pos)

{
  pointer puVar1;
  
  puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((ulong)pos <=
      (ulong)((long)(this->buffer_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1)) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,puVar1 + pos);
    this->findHeader_ = false;
    this->dataSize_ = 0;
    tryUnpack(this);
    return;
  }
  __assert_fail("buffer_.size() >= pos",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shuai132[P]PacketProcessor/PacketProcessor.cpp"
                ,0x10c,"void PacketProcessor::restart(uint32_t)");
}

Assistant:

void PacketProcessor::restart(uint32_t pos) {
  PacketProcessor_LOGV("restart: pos=%u,  buffer_.size()=%zu", pos, buffer_.size());
  assert(buffer_.size() >= pos);

  buffer_.assign(buffer_.cbegin() + pos, buffer_.cend());

  findHeader_ = false;
  dataSize_ = 0;

  // 每次解包成功后 要继续尝试解包 因为缓冲可能包含多个包
  tryUnpack();
}